

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::INVOKE_EXP<void(SQCompiler::*)()>(SQCompiler *this,offset_in_SQCompiler_to_subr f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RDX;
  code *in_RSI;
  long in_RDI;
  SQExpState es;
  code *local_68;
  
  uVar1 = *(undefined8 *)(in_RDI + 0xe0);
  uVar2 = *(undefined8 *)(in_RDI + 0xd0);
  uVar3 = *(undefined8 *)(in_RDI + 0xd8);
  *(undefined8 *)(in_RDI + 0xd0) = 1;
  *(undefined8 *)(in_RDI + 0xd8) = 0xffffffffffffffff;
  *(undefined1 *)(in_RDI + 0xe0) = 0;
  local_68 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_68 = *(code **)(in_RSI + *(long *)(in_RDI + in_RDX) + -1);
  }
  (*local_68)((long *)(in_RDI + in_RDX));
  *(undefined8 *)(in_RDI + 0xd0) = uVar2;
  *(undefined8 *)(in_RDI + 0xd8) = uVar3;
  *(undefined8 *)(in_RDI + 0xe0) = uVar1;
  return;
}

Assistant:

void INVOKE_EXP(T f)
    {
        SQExpState es = _es;
        _es.etype     = EXPR;
        _es.epos      = -1;
        _es.donot_get = false;
        (this->*f)();
        _es = es;
    }